

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O1

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setValue(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int i,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *x)

{
  uint *puVar1;
  int *piVar2;
  pointer pnVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int32_t iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_bc;
  cpp_dec_float<100U,_int,_void> local_b8;
  cpp_dec_float<100U,_int,_void> local_68;
  
  local_bc = i;
  if (this->setupStatus == true) {
    uVar12 = IdxSet::pos(&this->super_IdxSet,i);
    if ((int)uVar12 < 0) {
      local_b8.data._M_elems._0_8_ = *(undefined8 *)(x->m_backend).data._M_elems;
      local_b8.data._M_elems._8_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 2);
      local_b8.data._M_elems._16_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 4);
      local_b8.data._M_elems._24_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 6);
      local_b8.data._M_elems._32_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 8);
      local_b8.data._M_elems._40_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 10);
      local_b8.data._M_elems._48_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 0xc);
      local_b8.data._M_elems._56_8_ = *(undefined8 *)((x->m_backend).data._M_elems + 0xe);
      local_b8.exp = (x->m_backend).exp;
      local_b8.neg = (x->m_backend).neg;
      local_b8.fpclass = (x->m_backend).fpclass;
      local_b8.prec_elem = (x->m_backend).prec_elem;
      if ((local_b8.neg == true) &&
         (local_b8.fpclass != cpp_dec_float_finite || local_b8.data._M_elems[0] != 0)) {
        local_b8.neg = false;
      }
      getEpsilon((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&local_68,this);
      if ((local_b8.fpclass != cpp_dec_float_NaN) && (local_68.fpclass != cpp_dec_float_NaN)) {
        iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_b8,&local_68);
        if (0 < iVar13) {
          IdxSet::add(&this->super_IdxSet,1,&local_bc);
        }
      }
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                (&local_b8,0,(type *)0x0);
      if (((x->m_backend).fpclass != cpp_dec_float_NaN) && (local_b8.fpclass != cpp_dec_float_NaN))
      {
        iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&x->m_backend,&local_b8);
        if (iVar13 == 0) {
          piVar2 = (this->super_IdxSet).idx;
          pnVar3 = (this->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar13 = piVar2[uVar12];
          pnVar3[iVar13].m_backend.fpclass = cpp_dec_float_finite;
          pnVar3[iVar13].m_backend.prec_elem = 0x10;
          *(undefined1 (*) [16])&pnVar3[iVar13].m_backend.data = (undefined1  [16])0x0;
          puVar1 = (uint *)((long)&pnVar3[iVar13].m_backend.data + 0x10);
          puVar1[0] = 0;
          puVar1[1] = 0;
          puVar1[2] = 0;
          puVar1[3] = 0;
          puVar1 = (uint *)((long)&pnVar3[iVar13].m_backend.data + 0x20);
          puVar1[0] = 0;
          puVar1[1] = 0;
          puVar1[2] = 0;
          puVar1[3] = 0;
          puVar1 = (uint *)((long)&pnVar3[iVar13].m_backend.data + 0x30);
          puVar1[0] = 0;
          puVar1[1] = 0;
          puVar1[2] = 0;
          puVar1[3] = 0;
          *(undefined8 *)((long)&pnVar3[iVar13].m_backend.data + 0x3d) = 0;
          iVar13 = (this->super_IdxSet).num;
          (this->super_IdxSet).num = iVar13 + -1;
          piVar2[uVar12] = piVar2[(long)iVar13 + -1];
        }
      }
    }
  }
  lVar14 = (long)local_bc;
  pnVar3 = (this->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = *(undefined8 *)(x->m_backend).data._M_elems;
  uVar5 = *(undefined8 *)((x->m_backend).data._M_elems + 2);
  uVar6 = *(undefined8 *)((x->m_backend).data._M_elems + 4);
  uVar7 = *(undefined8 *)((x->m_backend).data._M_elems + 6);
  uVar8 = *(undefined8 *)((x->m_backend).data._M_elems + 8);
  uVar9 = *(undefined8 *)((x->m_backend).data._M_elems + 10);
  uVar10 = *(undefined8 *)((x->m_backend).data._M_elems + 0xe);
  puVar1 = (uint *)((long)&pnVar3[lVar14].m_backend.data + 0x30);
  *(undefined8 *)puVar1 = *(undefined8 *)((x->m_backend).data._M_elems + 0xc);
  *(undefined8 *)(puVar1 + 2) = uVar10;
  puVar1 = (uint *)((long)&pnVar3[lVar14].m_backend.data + 0x20);
  *(undefined8 *)puVar1 = uVar8;
  *(undefined8 *)(puVar1 + 2) = uVar9;
  puVar1 = (uint *)((long)&pnVar3[lVar14].m_backend.data + 0x10);
  *(undefined8 *)puVar1 = uVar6;
  *(undefined8 *)(puVar1 + 2) = uVar7;
  *(undefined8 *)&pnVar3[lVar14].m_backend.data = uVar4;
  *(undefined8 *)((long)&pnVar3[lVar14].m_backend.data + 8) = uVar5;
  pnVar3[lVar14].m_backend.exp = (x->m_backend).exp;
  pnVar3[lVar14].m_backend.neg = (x->m_backend).neg;
  iVar11 = (x->m_backend).prec_elem;
  pnVar3[lVar14].m_backend.fpclass = (x->m_backend).fpclass;
  pnVar3[lVar14].m_backend.prec_elem = iVar11;
  return;
}

Assistant:

void setValue(int i, R x)
   {
      assert(i >= 0);
      assert(i < VectorBase<R>::dim());

      if(isSetup())
      {
         int n = pos(i);

         if(n < 0)
         {
            if(spxAbs(x) > this->getEpsilon())
               IdxSet::add(1, &i);
         }
         else if(x == R(0))
            clearNum(n);
      }

      VectorBase<R>::val[i] = x;

      assert(isConsistent());
   }